

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<double>::AutoFill
          (TPZBlockDiagonal<double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  TPZStack<int,_10> blsizes;
  double local_b8;
  long local_b0;
  long local_a0;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    for (lVar8 = 0; lVar10 = neq - lVar8, lVar10 != 0 && lVar8 <= neq; lVar8 = lVar8 + lVar10) {
      iVar3 = rand();
      lVar4 = (iVar3 * neq) / 0x7fffffff;
      if (lVar4 < lVar10) {
        lVar10 = lVar4;
      }
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar10);
    }
    Initialize(this,&local_78.super_TPZVec<int>);
    lVar8 = (this->fBlockSize).fNElements;
    lVar10 = 0;
    if (lVar8 < 1) {
      lVar8 = lVar10;
    }
    for (; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar4 = (this->fBlockPos).fStore[lVar10];
      lVar9 = (long)(this->fBlockSize).fStore[lVar10];
      lVar6 = 0;
      if (0 < lVar9) {
        lVar6 = lVar9;
      }
      local_b0 = lVar4 * 8;
      lVar1 = lVar9 * 8;
      local_a0 = local_b0;
      for (lVar11 = 0; lVar11 != lVar6; lVar11 = lVar11 + 1) {
        if (symmetric == 1) {
          pdVar2 = (this->fStorage).fStore;
          pdVar5 = (double *)((long)pdVar2 + local_b0);
          local_b8 = 0.0;
          for (lVar7 = 0; lVar12 = lVar11, lVar11 != lVar7; lVar7 = lVar7 + 1) {
            dVar13 = *(double *)((long)pdVar2 + lVar7 * 8 + local_a0);
            *pdVar5 = dVar13;
            local_b8 = local_b8 + ABS(dVar13);
            pdVar5 = pdVar5 + lVar9;
          }
        }
        else {
          local_b8 = 0.0;
          lVar12 = 0;
        }
        lVar7 = lVar1 * lVar12 + local_b0;
        for (; lVar12 < lVar9; lVar12 = lVar12 + 1) {
          dVar13 = TPZMatrix<double>::GetRandomVal(&this->super_TPZMatrix<double>);
          *(double *)((long)(this->fStorage).fStore + lVar7) = dVar13;
          if (lVar11 != lVar12) {
            local_b8 = local_b8 + ABS(dVar13);
          }
          lVar7 = lVar7 + lVar1;
        }
        pdVar2 = (this->fStorage).fStore;
        if (ABS(pdVar2[lVar4 + lVar11 + lVar11 * lVar9]) < local_b8) {
          pdVar2[lVar4 + lVar11 + lVar11 * lVar9] = local_b8 + 1.0;
        }
        local_a0 = local_a0 + lVar1;
        local_b0 = local_b0 + 8;
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}